

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mux.c
# Opt level: O3

int envy_bios_parse_mux(envy_bios *bios)

{
  ushort uVar1;
  envy_bios_mux_entry *peVar2;
  byte bVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  long lVar8;
  envy_bios_mux_entry *peVar9;
  undefined8 uVar10;
  uint uVar11;
  ulong uVar12;
  int iVar13;
  byte bVar14;
  char *__format;
  long lVar15;
  
  uVar1 = (bios->mux).offset;
  iVar4 = 0;
  if (uVar1 != 0) {
    uVar7 = bios->length;
    if (uVar1 < uVar7) {
      (bios->mux).version = bios->data[(uint)uVar1];
      iVar4 = 0;
    }
    else {
      (bios->mux).version = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      uVar1 = (bios->mux).offset;
      uVar7 = bios->length;
      iVar4 = -0xe;
    }
    uVar12 = (ulong)uVar1;
    lVar8 = uVar12 + 1;
    if ((uint)lVar8 < uVar7) {
      (bios->mux).hlen = bios->data[lVar8];
      iVar13 = 0;
    }
    else {
      (bios->mux).hlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar8);
      uVar12 = (ulong)(bios->mux).offset;
      uVar7 = bios->length;
      iVar13 = -0xe;
    }
    uVar11 = (uint)uVar12;
    lVar8 = uVar12 + 2;
    if ((uint)lVar8 < uVar7) {
      (bios->mux).entriesnum = bios->data[lVar8];
      iVar5 = 0;
    }
    else {
      (bios->mux).entriesnum = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n",lVar8);
      uVar11 = (uint)(bios->mux).offset;
      uVar7 = bios->length;
      iVar5 = -0xe;
    }
    if ((uint)((ulong)uVar11 + 3) < uVar7) {
      (bios->mux).rlen = bios->data[(ulong)uVar11 + 3];
      iVar6 = 0;
    }
    else {
      (bios->mux).rlen = '\0';
      fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
      iVar6 = -0xe;
    }
    if (((iVar13 == 0 && iVar4 == 0) && iVar5 == 0) && iVar6 == 0) {
      envy_bios_block(bios,(uint)(bios->mux).offset,
                      (uint)(bios->mux).entriesnum * (uint)(bios->mux).rlen + (uint)(bios->mux).hlen
                      ,"MUX",-1);
      if ((bios->mux).version == '\x10') {
        bVar14 = (bios->mux).hlen;
        uVar12 = (ulong)bVar14;
        if (bVar14 < 4) {
          __format = "MUX table header too short [%d < %d]\n";
          uVar10 = 4;
        }
        else {
          bVar3 = (bios->mux).rlen;
          if (4 < bVar3) {
            if (bVar14 != 4) {
              fprintf(_stderr,"MUX table header longer than expected [%d > %d]\n",uVar12,4);
              bVar3 = (bios->mux).rlen;
            }
            if (5 < bVar3) {
              envy_bios_parse_mux_cold_2();
            }
            bVar14 = (bios->mux).entriesnum;
            peVar9 = (envy_bios_mux_entry *)calloc((ulong)bVar14,0x14);
            (bios->mux).entries = peVar9;
            if (peVar9 == (envy_bios_mux_entry *)0x0) {
              return -0xc;
            }
            if (bVar14 != 0) {
              lVar8 = 0xf;
              uVar12 = 0;
              do {
                peVar2 = (bios->mux).entries;
                peVar9 = peVar2 + uVar12;
                uVar7 = (uint)(bios->mux).rlen * (int)uVar12 +
                        (uint)(bios->mux).hlen + (uint)(bios->mux).offset;
                peVar9->offset = (uint16_t)uVar7;
                uVar7 = uVar7 & 0xffff;
                if (uVar7 < bios->length) {
                  peVar9->idx = bios->data[uVar7];
                  uVar7 = 0;
                }
                else {
                  peVar9->idx = '\0';
                  fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                  uVar7 = 0xfffffff2;
                }
                lVar15 = -4;
                do {
                  if ((int)lVar15 + (uint)peVar9->offset + 5 < bios->length) {
                    bVar14 = bios->data[lVar15 + 5 + (ulong)peVar9->offset];
                    uVar11 = 0;
                  }
                  else {
                    bVar14 = 0;
                    fprintf(_stderr,"requested OOB u8 at 0x%04x\n");
                    uVar11 = 0xfffffff2;
                  }
                  uVar7 = uVar7 | uVar11;
                  peVar2->sub_loc[lVar15 + lVar8 + -0xb] = bVar14 & 1;
                  peVar2->sub_loc[lVar15 + lVar8 + -7] = bVar14 >> 1 & 0x1f;
                  peVar2->sub_loc[lVar15 + lVar8 + -3] = bVar14 >> 6 & 1;
                  peVar2->sub_loc[lVar15 + lVar8 + 1] = bVar14 >> 7;
                  lVar15 = lVar15 + 1;
                } while (lVar15 != 0);
                if (uVar7 != 0) goto LAB_0025d4dc;
                uVar12 = uVar12 + 1;
                lVar8 = lVar8 + 0x14;
              } while (uVar12 < (bios->mux).entriesnum);
            }
            (bios->mux).valid = '\x01';
            return 0;
          }
          __format = "MUX table record too short [%d < %d]\n";
          uVar12 = (ulong)(uint)bVar3;
          uVar10 = 5;
        }
        fprintf(_stderr,__format,uVar12,uVar10);
      }
      else {
        envy_bios_parse_mux_cold_1();
      }
      iVar4 = -0x16;
    }
    else {
LAB_0025d4dc:
      iVar4 = -0xe;
    }
  }
  return iVar4;
}

Assistant:

int envy_bios_parse_mux (struct envy_bios *bios) {
	struct envy_bios_mux *mux = &bios->mux;
	if (!mux->offset)
		return 0;
	int err = 0;
	err |= bios_u8(bios, mux->offset, &mux->version);
	err |= bios_u8(bios, mux->offset+1, &mux->hlen);
	err |= bios_u8(bios, mux->offset+2, &mux->entriesnum);
	err |= bios_u8(bios, mux->offset+3, &mux->rlen);
	if (err)
		return -EFAULT;
	envy_bios_block(bios, mux->offset, mux->hlen + mux->rlen * mux->entriesnum, "MUX", -1);
	int wanthlen = 0;
	int wantrlen = 0;
	switch (mux->version) {
		case 0x10:
			wanthlen = 4;
			wantrlen = 5;
			break;
		default:
			ENVY_BIOS_ERR("Unknown MUX table version %d.%d\n", mux->version >> 4, mux->version & 0xf);
			return -EINVAL;
	}
	if (mux->hlen < wanthlen) {
		ENVY_BIOS_ERR("MUX table header too short [%d < %d]\n", mux->hlen, wanthlen);
		return -EINVAL;
	}
	if (mux->rlen < wantrlen) {
		ENVY_BIOS_ERR("MUX table record too short [%d < %d]\n", mux->rlen, wantrlen);
		return -EINVAL;
	}
	if (mux->hlen > wanthlen) {
		ENVY_BIOS_WARN("MUX table header longer than expected [%d > %d]\n", mux->hlen, wanthlen);
	}
	if (mux->rlen > wantrlen) {
		ENVY_BIOS_WARN("MUX table record longer than expected [%d > %d]\n", mux->rlen, wantrlen);
	}
	mux->entries = calloc(mux->entriesnum, sizeof *mux->entries);
	if (!mux->entries)
		return -ENOMEM;
	int i;
	for (i = 0; i < mux->entriesnum; i++) {
		struct envy_bios_mux_entry *entry = &mux->entries[i];
		entry->offset = mux->offset + mux->hlen + mux->rlen * i;
		uint8_t sub[4];
		err |= bios_u8(bios, entry->offset, &entry->idx);
		int j;
		for (j = 0; j < 4; j++) {
			err |= bios_u8(bios, entry->offset+j+1, &sub[j]);
			entry->sub_loc[j] = sub[j] & 1;
			entry->sub_line[j] = sub[j] >> 1 & 0x1f;
			entry->sub_val[j] = sub[j] >> 6 & 1;
			entry->sub_unk7[j] = sub[j] >> 7 & 1;
		}
		if (err)
			return -EFAULT;
	}
	mux->valid = 1;
	return 0;
}